

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConcurrentAssertionStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConcurrentAssertionStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::PropertySpecSyntax&,slang::parsing::Token,slang::syntax::ActionBlockSyntax&>
          (BumpAllocator *this,SyntaxKind *args,NamedLabelSyntax **args_1,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,Token *args_3,Token *args_4,
          Token *args_5,PropertySpecSyntax *args_6,Token *args_7,ActionBlockSyntax *args_8)

{
  Token propertyOrSequence;
  Token openParen;
  Token closeParen;
  ConcurrentAssertionStatementSyntax *this_00;
  ActionBlockSyntax *in_RCX;
  Info *in_R8;
  undefined8 *in_R9;
  long in_stack_00000008;
  Token *in_stack_00000018;
  NamedLabelSyntax *in_stack_00000020;
  size_t in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  BumpAllocator *in_stack_ffffffffffffff48;
  SyntaxKind in_stack_ffffffffffffff6c;
  
  this_00 = (ConcurrentAssertionStatementSyntax *)
            allocate(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  propertyOrSequence.info = (Info *)*in_R9;
  propertyOrSequence._0_8_ = *(undefined8 *)(in_stack_00000008 + 8);
  openParen.info = (Info *)in_R8->rawTextPtr;
  openParen._0_8_ = in_R9[1];
  closeParen.info = in_R8;
  closeParen._0_8_ = in_R9;
  slang::syntax::ConcurrentAssertionStatementSyntax::ConcurrentAssertionStatementSyntax
            (this_00,in_stack_ffffffffffffff6c,in_stack_00000020,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_00000018->info,
             *in_stack_00000018,propertyOrSequence,openParen,(PropertySpecSyntax *)in_R8->location,
             closeParen,in_RCX);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }